

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void remove_show_script_command
               (Am_Object *execute_script_command,Am_Object *cmd_for_menu_bar,Am_Object *undo_db)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  ostream *poVar3;
  undefined1 local_60 [8];
  Am_Value_List sub_list;
  Am_Object cmd;
  undefined1 local_38 [8];
  Am_Value_List bar_list;
  Am_Object menu_bar;
  Am_Object *undo_db_local;
  Am_Object *cmd_for_menu_bar_local;
  Am_Object *execute_script_command_local;
  
  pAVar2 = Am_Object::Get(undo_db,Am_UNDO_MENU_BAR,0);
  Am_Object::Am_Object((Am_Object *)&bar_list.item,pAVar2);
  pAVar2 = Am_Object::Get((Am_Object *)&bar_list.item,0xa2,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_38,pAVar2);
  Am_Value_List::Start((Am_Value_List *)local_38);
  Am_Value_List::Next((Am_Value_List *)local_38);
  Am_Value_List::Next((Am_Value_List *)local_38);
  Am_Value_List::Next((Am_Value_List *)local_38);
  pAVar2 = Am_Value_List::Get((Am_Value_List *)local_38);
  Am_Object::Am_Object((Am_Object *)&sub_list.item,pAVar2);
  pAVar2 = Am_Object::Get((Am_Object *)&sub_list.item,0xa2,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_60,pAVar2);
  Am_Value_List::Start((Am_Value_List *)local_60);
  value = Am_Object::operator_cast_to_Am_Wrapper_(cmd_for_menu_bar);
  bVar1 = Am_Value_List::Member((Am_Value_List *)local_60,value);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar3 = std::operator<<(poVar3,"Lost cmd_for_menu_bar ");
    poVar3 = operator<<(poVar3,cmd_for_menu_bar);
    poVar3 = std::operator<<(poVar3," for execute ");
    poVar3 = operator<<(poVar3,execute_script_command);
    poVar3 = std::operator<<(poVar3," from list ");
    poVar3 = operator<<(poVar3,(Am_Value_List *)local_60);
    poVar3 = std::operator<<(poVar3," on menubar cmd ");
    poVar3 = operator<<(poVar3,(Am_Object *)&sub_list.item);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  Am_Value_List::Delete((Am_Value_List *)local_60,false);
  Am_Object::Note_Changed((Am_Object *)&sub_list.item,0xa2);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_60);
  Am_Object::~Am_Object((Am_Object *)&sub_list.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_38);
  Am_Object::~Am_Object((Am_Object *)&bar_list.item);
  return;
}

Assistant:

void
remove_show_script_command(Am_Object &execute_script_command,
                           Am_Object &cmd_for_menu_bar, Am_Object &undo_db)
{
  Am_Object menu_bar = undo_db.Get(Am_UNDO_MENU_BAR);
  Am_Value_List bar_list = menu_bar.Get(Am_ITEMS);
  bar_list.Start();                           //at File
  bar_list.Next();                            //at Undo/Redo/Repeat
  bar_list.Next();                            //at Find
  bar_list.Next();                            //at Scripting
  Am_Object cmd = bar_list.Get();             //scripting's command
  Am_Value_List sub_list = cmd.Get(Am_ITEMS); //scripting's sub-menu
  sub_list.Start();
  if (!sub_list.Member(cmd_for_menu_bar))
    Am_ERROR("Lost cmd_for_menu_bar " << cmd_for_menu_bar << " for execute "
                                      << execute_script_command << " from list "
                                      << sub_list << " on menubar cmd " << cmd);
  sub_list.Delete(false);
  cmd.Note_Changed(Am_ITEMS);
}